

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::SwapElements
          (RepeatedField<float> *this,int index1,int index2)

{
  float fVar1;
  float *pfVar2;
  
  pfVar2 = elements(this,(undefined1  [16])
                         ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
  fVar1 = pfVar2[index1];
  pfVar2[index1] = pfVar2[index2];
  pfVar2[index2] = fVar1;
  return;
}

Assistant:

void RepeatedField<Element>::SwapElements(int index1, int index2) {
  Element* elem = elements(is_soo());
  using std::swap;  // enable ADL with fallback
  swap(elem[index1], elem[index2]);
}